

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qplaintextedit.cpp
# Opt level: O2

void __thiscall QPlainTextEdit::~QPlainTextEdit(QPlainTextEdit *this)

{
  long lVar1;
  long lVar2;
  bool bVar3;
  
  *(undefined ***)&(this->super_QAbstractScrollArea).super_QFrame.super_QWidget =
       &PTR_metaObject_007d64f0;
  *(undefined ***)&(this->super_QAbstractScrollArea).super_QFrame.super_QWidget.super_QPaintDevice =
       &PTR__QPlainTextEdit_007d66f0;
  lVar1 = *(long *)&(this->super_QAbstractScrollArea).super_QFrame.super_QWidget.field_0x8;
  bVar3 = QPointer::operator_cast_to_bool((QPointer *)(lVar1 + 0x350));
  if (((bVar3) && (*(long *)(lVar1 + 0x350) != 0)) &&
     (lVar2 = *(long *)(*(long *)(lVar1 + 0x358) + 8), *(long *)(lVar2 + 0xb0) == lVar1)) {
    *(undefined8 *)(lVar2 + 0xb0) = 0;
  }
  QAbstractScrollArea::~QAbstractScrollArea((QAbstractScrollArea *)this);
  return;
}

Assistant:

QPlainTextEdit::~QPlainTextEdit()
{
    Q_D(QPlainTextEdit);
    if (d->documentLayoutPtr) {
        if (d->documentLayoutPtr->priv()->mainViewPrivate == d)
            d->documentLayoutPtr->priv()->mainViewPrivate = nullptr;
    }
}